

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

BinaryConditionalDirectiveExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BinaryConditionalDirectiveExpressionSyntax,slang::syntax::BinaryConditionalDirectiveExpressionSyntax_const&>
          (BumpAllocator *this,BinaryConditionalDirectiveExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  ConditionalDirectiveExpressionSyntax *pCVar3;
  Info *pIVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  BinaryConditionalDirectiveExpressionSyntax *pBVar10;
  
  pBVar10 = (BinaryConditionalDirectiveExpressionSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((BinaryConditionalDirectiveExpressionSyntax *)this->endPtr < pBVar10 + 1) {
    pBVar10 = (BinaryConditionalDirectiveExpressionSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pBVar10 + 1);
  }
  (pBVar10->right).ptr = (args->right).ptr;
  SVar8 = (args->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.kind;
  uVar9 = *(undefined4 *)
           &(args->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.previewNode;
  pCVar3 = (args->left).ptr;
  uVar5 = (args->op).field_0x2;
  NVar6.raw = (args->op).numFlags.raw;
  uVar7 = (args->op).rawLen;
  pIVar4 = (args->op).info;
  (pBVar10->op).kind = (args->op).kind;
  (pBVar10->op).field_0x2 = uVar5;
  (pBVar10->op).numFlags = (NumericTokenFlags)NVar6.raw;
  (pBVar10->op).rawLen = uVar7;
  (pBVar10->op).info = pIVar4;
  (pBVar10->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pBVar10->left).ptr = pCVar3;
  (pBVar10->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.kind = SVar8;
  *(undefined4 *)&(pBVar10->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.field_0x4 =
       uVar9;
  (pBVar10->super_ConditionalDirectiveExpressionSyntax).super_SyntaxNode.parent = pSVar1;
  return pBVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }